

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTFactory.cpp
# Opt level: O1

void __thiscall
antlr::ASTFactory::ASTFactory(ASTFactory *this,char *factory_node_name,factory_type fact)

{
  value_type local_20;
  
  this->_vptr_ASTFactory = (_func_int **)&PTR__ASTFactory_00306060;
  local_20 = &this->default_factory_descriptor;
  (this->default_factory_descriptor).first = factory_node_name;
  (this->default_factory_descriptor).second = (_func_ASTRefCount<antlr::AST> *)fact;
  (this->nodeFactories).
  super__Vector_base<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*,_std::allocator<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->nodeFactories).
  super__Vector_base<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*,_std::allocator<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->nodeFactories).
  super__Vector_base<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*,_std::allocator<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*,_std::allocator<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*>_>
  ::resize(&this->nodeFactories,4,&local_20);
  return;
}

Assistant:

ASTFactory::ASTFactory( const char* factory_node_name, factory_type fact )
: default_factory_descriptor(ANTLR_USE_NAMESPACE(std)make_pair(factory_node_name, fact))
{
	nodeFactories.resize( Token::MIN_USER_TYPE, &default_factory_descriptor );
}